

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.c
# Opt level: O0

void test_len(void)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_30 [8];
  queue_t queue;
  qdata_t qdata;
  int i;
  
  fprintf(_stderr,"test_len() started\n");
  uVar2 = queue_init(local_30);
  if ((uVar2 & 1) == 0) {
    __assert_fail("queue_init(&queue)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                  ,0x4a,"void test_len()");
  }
  qdata.i64._4_4_ = 0;
  while( true ) {
    if (999999 < (int)qdata.i64._4_4_) {
      iVar1 = queue_len(local_30);
      if (iVar1 != 1000000) {
        __assert_fail("LEN == queue_len(&queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                      ,0x51,"void test_len()");
      }
      qdata.i64._4_4_ = 0;
      while( true ) {
        if (999999 < (int)qdata.i64._4_4_) {
          iVar1 = queue_len(local_30);
          if (iVar1 == 0) {
            queue_clear(local_30);
            fprintf(_stderr,"test_len() succeed\n");
            return;
          }
          __assert_fail("0 == queue_len(&queue)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                        ,0x58,"void test_len()");
        }
        uVar2 = queue_dequeue(local_30,&queue.len);
        if ((uVar2 & 1) == 0) break;
        if (data[(int)qdata.i64._4_4_] != queue.len) {
          __assert_fail("data[i] == qdata.i32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                        ,0x55,"void test_len()");
        }
        qdata.i64._4_4_ = qdata.i64._4_4_ + 1;
      }
      __assert_fail("queue_dequeue(&queue, &qdata)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                    ,0x54,"void test_len()");
    }
    queue.len = data[(int)qdata.i64._4_4_];
    uVar2 = queue_enqueue(local_30,CONCAT44(queue._20_4_,queue.len));
    if ((uVar2 & 1) == 0) break;
    qdata.i64._4_4_ = qdata.i64._4_4_ + 1;
  }
  __assert_fail("queue_enqueue(&queue, qdata)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                ,0x4e,"void test_len()");
}

Assistant:

void test_len()
{
    int i;
    qdata_t qdata;
    queue_t queue;

    fprintf(stderr, "test_len() started\n");

    assert(queue_init(&queue));

    for (i = 0; i < LEN; ++i) {
        qdata.i32 = data[i];
        assert(queue_enqueue(&queue, qdata));
    }

    assert(LEN == queue_len(&queue));

    for (i = 0; i < LEN; ++i) {
        assert(queue_dequeue(&queue, &qdata));
        assert(data[i] == qdata.i32);
    }

    assert(0 == queue_len(&queue));

    queue_clear(&queue);

    fprintf(stderr, "test_len() succeed\n");
}